

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hole.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  zip_source_t *from;
  zip_source_t *to;
  bool bVar5;
  bool bVar6;
  char *fname;
  int *unaff_R13;
  
  progname = *argv;
  bVar1 = true;
  bVar2 = false;
  while( true ) {
    do {
      bVar6 = bVar2;
      bVar5 = bVar1;
      fname = (char *)(ulong)(uint)argc;
      iVar3 = getopt(argc,argv,"du");
      bVar1 = false;
      bVar2 = true;
    } while (iVar3 == 100);
    if (iVar3 != 0x75) break;
    bVar1 = false;
    bVar2 = false;
  }
  if (iVar3 == -1) {
    unaff_R13 = (int *)&optind;
    if (_optind + 2 != argc) goto LAB_001023b0;
    fname = argv[_optind];
    if (bVar5) {
      from = open_file(fname);
      goto LAB_001023bc;
    }
  }
  else {
LAB_001023b0:
    usage();
  }
  from = open_compressed(fname,0);
LAB_001023bc:
  if (bVar6) {
    to = open_file(argv[(long)*unaff_R13 + 1]);
  }
  else {
    to = open_compressed(argv[(long)*unaff_R13 + 1],1);
  }
  uVar4 = copy_source(from,to);
  zip_source_free(from);
  zip_source_free(to);
  exit(uVar4 >> 0x1f);
}

Assistant:

int
main(int argc, char **argv) {
    zip_source_t *from;
    zip_source_t *to;
    int c, err;
    int compress = 1;
    int decompress = 0;

    progname = argv[0];

    while ((c = getopt(argc, argv, "du")) != -1) {
	switch (c) {
	case 'd':
	    compress = 0;
	    decompress = 1;
	    break;

	case 'u':
	    compress = 1;
	    decompress = 1;
	    break;

	default:
	    usage();
	    break;
	}
    }

    if (optind + 2 != argc) {
	usage();
    }

    if (decompress) {
	from = open_compressed(argv[optind], 0);
    }
    else {
	from = open_file(argv[optind]);
    }

    if (compress) {
	to = open_compressed(argv[optind + 1], ZIP_CREATE);
    }
    else {
	to = open_file(argv[optind + 1]);
    }

    err = copy_source(from, to);

    zip_source_free(from);
    zip_source_free(to);

    exit(err < 0 ? 1 : 0);
}